

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

void borg_send_inscribe(wchar_t i,char *str)

{
  char cVar1;
  char *pcVar2;
  
  borg_keypress(0x7b);
  if ((int)(uint)z_info->pack_size <= i) {
    if (borg_items->iqty != '\0') {
      borg_keypress(0x2f);
    }
    i = i - (uint)z_info->pack_size;
  }
  borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i]);
  cVar1 = *str;
  if (cVar1 != '\0') {
    pcVar2 = str + 1;
    do {
      borg_keypress((int)cVar1);
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  borg_keypress(0x9c);
  return;
}

Assistant:

void borg_send_inscribe(int i, char* str)
{
    char* s;

    /* Label it */
    borg_keypress('{');

    /* Choose from inventory */
    if (i < INVEN_WIELD) {
        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i]);
    }

    /* Choose from equipment */
    else {
        /* Go to equipment (if necessary) */
        if (borg_items[0].iqty)
            borg_keypress('/');

        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);
    }

    /* Send the label */
    for (s = str; *s; s++)
        borg_keypress(*s);

    /* End the inscription */
    borg_keypress(KC_ENTER);
}